

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O2

void emitfromone(opcodetype opcode,char *label,int tabindex)

{
  int iVar1;
  datatype dVar2;
  char source [10];
  
  getlabel(tabindex,source);
  fprintf((FILE *)ofp,"         %-10s%s, ",opcodestr[opcode],label);
  iVar1 = bcmp(source,"[bp",3);
  if (iVar1 == 0) {
    dVar2 = data_class(tabindex);
    if (dVar2 == dtreal) {
      putc(100,(FILE *)ofp);
    }
    fwrite("word ptr ",9,1,(FILE *)ofp);
  }
  fprintf((FILE *)ofp,"%s\n",source);
  return;
}

Assistant:

void    emitfromone(enum opcodetype opcode, char *label, int tabindex)
{
    char    source[LABELSIZE];
    
    getlabel(tabindex, source);
    
    fprintf(ofp, "         %-10s%s, ", opcodestr[opcode], label);
    if (strncmp(source, "[bp", 3) == 0)    {
        if (data_class(tabindex) == dtreal)
            putc('d', ofp);
        fprintf(ofp, "word ptr ");
    }
    
    fprintf(ofp, "%s\n", source);
}